

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cc
# Opt level: O3

tm * __thiscall iqxmlrpc::Value::operator_cast_to_tm(tm *__return_storage_ptr__,Value *this)

{
  char *pcVar1;
  pointer pcVar2;
  long lVar3;
  int iVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  Date_time *pDVar14;
  long *local_38 [2];
  long local_28 [2];
  
  pDVar14 = cast<iqxmlrpc::Date_time>(this);
  iVar10 = (pDVar14->tm_).tm_sec;
  iVar11 = (pDVar14->tm_).tm_min;
  iVar12 = (pDVar14->tm_).tm_hour;
  iVar13 = (pDVar14->tm_).tm_mday;
  iVar6 = (pDVar14->tm_).tm_mon;
  iVar7 = (pDVar14->tm_).tm_year;
  iVar8 = (pDVar14->tm_).tm_wday;
  iVar9 = (pDVar14->tm_).tm_yday;
  iVar4 = (pDVar14->tm_).tm_isdst;
  uVar5 = *(undefined4 *)&(pDVar14->tm_).field_0x24;
  lVar3 = (pDVar14->tm_).tm_gmtoff;
  pcVar1 = (pDVar14->tm_).tm_zone;
  pcVar2 = (pDVar14->cache)._M_dataplus._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar2,pcVar2 + (pDVar14->cache)._M_string_length);
  __return_storage_ptr__->tm_zone = pcVar1;
  __return_storage_ptr__->tm_isdst = iVar4;
  *(undefined4 *)&__return_storage_ptr__->field_0x24 = uVar5;
  __return_storage_ptr__->tm_gmtoff = lVar3;
  __return_storage_ptr__->tm_mon = iVar6;
  __return_storage_ptr__->tm_year = iVar7;
  __return_storage_ptr__->tm_wday = iVar8;
  __return_storage_ptr__->tm_yday = iVar9;
  __return_storage_ptr__->tm_sec = iVar10;
  __return_storage_ptr__->tm_min = iVar11;
  __return_storage_ptr__->tm_hour = iVar12;
  __return_storage_ptr__->tm_mday = iVar13;
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Value::operator struct tm() const
{
  return get_datetime().get_tm();
}